

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# busyindicator.cpp
# Opt level: O1

void __thiscall QtMWidgets::BusyIndicator::BusyIndicator(BusyIndicator *this,QWidget *parent)

{
  BusyIndicatorPrivate *this_00;
  
  QWidget::QWidget(&this->super_QWidget,parent,0);
  *(undefined ***)this = &PTR_metaObject_00198190;
  *(undefined **)&this->field_0x10 = &DAT_00198340;
  this_00 = (BusyIndicatorPrivate *)operator_new(0x38);
  this_00->q = this;
  this_00->outerRadius = 10;
  this_00->innerRadius = 6;
  (this_00->size).wd = 0x14;
  (this_00->size).ht = 0x14;
  this_00->running = true;
  this_00->animation = (QVariantAnimation *)0x0;
  (this_00->color).cspec = Invalid;
  (this_00->color).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this_00->color).ct + 2) = 0;
  (this->d).d = this_00;
  BusyIndicatorPrivate::init(this_00,(EVP_PKEY_CTX *)parent);
  return;
}

Assistant:

BusyIndicator::BusyIndicator( QWidget * parent )
	:	QWidget( parent )
	,	d( new BusyIndicatorPrivate( this ) )
{
	d->init();
}